

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O2

void phyr::blackbody(double *lambda,int n,double t,double *Le)

{
  int i;
  int i_1;
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  
  uVar2 = 0;
  if (0 < n) {
    uVar2 = (ulong)(uint)n;
  }
  if (t <= 0.0) {
    for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      Le[uVar1] = 0.0;
    }
  }
  else {
    for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      dVar4 = lambda[uVar1] * 1e-09;
      dVar3 = exp(1.9864456832693028e-25 / (dVar4 * 1.3806488e-23 * t));
      Le[uVar1] = 1.1910428681415875e-16 / ((dVar3 + -1.0) * dVar4 * dVar4 * dVar4 * dVar4 * dVar4);
    }
  }
  return;
}

Assistant:

void blackbody(const Real* lambda, int n, Real t, Real* Le) {
    if (t <= 0) {
        for (int i = 0; i < n; ++i) Le[i] = 0.f;
        return;
    }
    const Real c = 299792458;
    const Real h = 6.62606957e-34;
    const Real kb = 1.3806488e-23;
    for (int i = 0; i < n; ++i) {
        // Compute emitted radiance for blackbody at wavelength {lambda[i]}
        Real l = lambda[i] * 1e-9;
        Real lambda5 = (l * l) * (l * l) * l;
        Le[i] = (2 * h * c * c) /
                (lambda5 * (std::exp((h * c) / (l * kb * t)) - 1));
        ASSERT(!std::isnan(Le[i]));
    }
}